

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceGLImpl.cpp
# Opt level: O0

void __thiscall
Diligent::RenderDeviceGLImpl::CreateFramebuffer
          (RenderDeviceGLImpl *this,FramebufferDesc *Desc,IFramebuffer **ppFramebuffer)

{
  bool bVar1;
  Char *Message;
  DeviceContextGLImpl *this_00;
  reference_wrapper<Diligent::GLContextState> local_68;
  GLContextState *local_60;
  GLContextState *GLState;
  undefined1 local_48 [8];
  string msg;
  RefCntAutoPtr<Diligent::DeviceContextGLImpl> pDeviceContext;
  IFramebuffer **ppFramebuffer_local;
  FramebufferDesc *Desc_local;
  RenderDeviceGLImpl *this_local;
  
  RenderDeviceBase<Diligent::EngineGLImplTraits>::GetImmediateContext
            ((RenderDeviceBase<Diligent::EngineGLImplTraits> *)((long)&msg.field_2 + 8),(size_t)this
            );
  bVar1 = RefCntAutoPtr<Diligent::DeviceContextGLImpl>::operator!
                    ((RefCntAutoPtr<Diligent::DeviceContextGLImpl> *)((long)&msg.field_2 + 8));
  if (bVar1) {
    FormatString<char[44]>
              ((string *)local_48,(char (*) [44])"Immediate device context has been destroyed");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"CreateFramebuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/RenderDeviceGLImpl.cpp"
               ,0x250);
    std::__cxx11::string::~string((string *)local_48);
  }
  this_00 = RefCntAutoPtr<Diligent::DeviceContextGLImpl>::operator->
                      ((RefCntAutoPtr<Diligent::DeviceContextGLImpl> *)((long)&msg.field_2 + 8));
  local_60 = DeviceContextGLImpl::GetContextState(this_00);
  local_68 = std::ref<Diligent::GLContextState>(local_60);
  RenderDeviceBase<Diligent::EngineGLImplTraits>::
  CreateFramebufferImpl<std::reference_wrapper<Diligent::GLContextState>>
            (&this->super_RenderDeviceBase<Diligent::EngineGLImplTraits>,ppFramebuffer,Desc,
             &local_68);
  RefCntAutoPtr<Diligent::DeviceContextGLImpl>::~RefCntAutoPtr
            ((RefCntAutoPtr<Diligent::DeviceContextGLImpl> *)((long)&msg.field_2 + 8));
  return;
}

Assistant:

void RenderDeviceGLImpl::CreateFramebuffer(const FramebufferDesc& Desc, IFramebuffer** ppFramebuffer)
{
    auto pDeviceContext = GetImmediateContext(0);
    VERIFY(pDeviceContext, "Immediate device context has been destroyed");
    auto& GLState = pDeviceContext->GetContextState();

    CreateFramebufferImpl(ppFramebuffer, Desc, std::ref(GLState));
}